

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

int anon_unknown.dwarf_b837c::ParseInteger(ExpressionContext *ctx,char *str)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    uVar1 = (int)(char)ctx->optimizationLevel - 0x30;
    if (9 < uVar1) break;
    iVar2 = uVar1 + iVar2 * 10;
    ctx = (ExpressionContext *)((long)&ctx->optimizationLevel + 1);
  }
  return iVar2;
}

Assistant:

int ParseInteger(ExpressionContext &ctx, const char* str)
	{
		(void)ctx;

		unsigned digit;
		int a = 0;

		while((digit = *str - '0') < 10)
		{
			a = a * 10 + digit;
			str++;
		}

		return a;
	}